

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

size_t helics::detail::convertToBinary(byte *data,complex<double> *val,size_t size)

{
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  
  addCodeAndSize(in_RSI,(byte)((ulong)in_RDX >> 0x38),0x381515);
  memcpy((void *)(in_RDI + 8),in_RSI,in_RDX << 4);
  return in_RDX * 0x10 + 8;
}

Assistant:

size_t convertToBinary(std::byte* data, const std::complex<double>* val, size_t size)
{
    addCodeAndSize(data, cvCode, size);
    std::memcpy(data + 8, val, size * sizeof(double) * 2);
    return size * sizeof(double) * 2U + 8U;
}